

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O0

void __thiscall
sglr::Context::texImage2D
          (Context *this,deUint32 target,int level,deUint32 internalFormat,Surface *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  deUint32 dVar4;
  uint uVar5;
  void *pvVar6;
  ConstPixelBufferAccess local_58;
  uint local_30;
  uint local_2c;
  int height;
  int width;
  Surface *src_local;
  uint local_18;
  deUint32 internalFormat_local;
  int level_local;
  deUint32 target_local;
  Context *this_local;
  
  _height = src;
  src_local._4_4_ = internalFormat;
  local_18 = level;
  internalFormat_local = target;
  _level_local = this;
  local_2c = tcu::Surface::getWidth(src);
  uVar5 = tcu::Surface::getHeight(_height);
  dVar4 = internalFormat_local;
  uVar3 = local_18;
  uVar2 = src_local._4_4_;
  uVar1 = local_2c;
  local_30 = uVar5;
  tcu::Surface::getAccess(&local_58,_height);
  pvVar6 = tcu::ConstPixelBufferAccess::getDataPtr(&local_58);
  (*this->_vptr_Context[0x11])
            (this,(ulong)dVar4,(ulong)uVar3,(ulong)uVar2,(ulong)uVar1,(ulong)uVar5,0,0x1908,0x1401,
             pvVar6);
  return;
}

Assistant:

void Context::texImage2D (deUint32 target, int level, deUint32 internalFormat, const tcu::Surface& src)
{
	int		width	= src.getWidth();
	int		height	= src.getHeight();
	texImage2D(target, level, internalFormat, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, src.getAccess().getDataPtr());
}